

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

void Fl::flush(void)

{
  Fl_X *pFVar1;
  Fl_Window *this;
  int iVar2;
  Fl_X **ppFVar3;
  
  if (damage_ != 0) {
    damage_ = 0;
    ppFVar3 = &Fl_X::first;
    while (pFVar1 = *ppFVar3, pFVar1 != (Fl_X *)0x0) {
      if (pFVar1->wait_for_expose == '\0') {
        this = pFVar1->w;
        iVar2 = Fl_Widget::visible_r((Fl_Widget *)this);
        if (iVar2 != 0) {
          if ((this->super_Fl_Group).super_Fl_Widget.damage_ != '\0') {
            (*(pFVar1->w->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])();
            (this->super_Fl_Group).super_Fl_Widget.damage_ = '\0';
          }
          if (pFVar1->region != (Fl_Region)0x0) {
            XDestroyRegion();
            pFVar1->region = (Fl_Region)0x0;
          }
        }
      }
      else {
        damage_ = 1;
      }
      ppFVar3 = &pFVar1->next;
    }
  }
  if (fl_display != (Display *)0x0) {
    XFlush();
    return;
  }
  return;
}

Assistant:

void Fl::flush() {
  if (damage()) {
    damage_ = 0;
    for (Fl_X* i = Fl_X::first; i; i = i->next) {
      if (i->wait_for_expose) {damage_ = 1; continue;}
      Fl_Window* wi = i->w;
      if (!wi->visible_r()) continue;
      if (wi->damage()) {i->flush(); wi->clear_damage();}
      // destroy damage regions for windows that don't use them:
      if (i->region) {XDestroyRegion(i->region); i->region = 0;}
    }
  }
#if defined(USE_X11)
  if (fl_display) XFlush(fl_display);
#elif defined(WIN32)
  GdiFlush();
#elif defined (__APPLE_QUARTZ__)
  if (fl_gc)
    CGContextFlush(fl_gc);
#else
# error unsupported platform
#endif
}